

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::CustomModel::Clear(CustomModel *this)

{
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  ::InnerMap::clear((InnerMap *)&this->parameters_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->classname_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->description_);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CustomModel::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CustomModel)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  parameters_.Clear();
  classname_.ClearToEmpty();
  description_.ClearToEmpty();
  _internal_metadata_.Clear<std::string>();
}